

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeWhile(Ref condition,Ref body)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)WHILE);
  pVVar2 = cashew::Value::push_back(RVar1.inst,r);
  pVVar2 = cashew::Value::push_back(pVVar2,condition);
  RVar1.inst = cashew::Value::push_back(pVVar2,body);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeWhile(Ref condition, Ref body) {
    return &makeRawArray(3)
              ->push_back(makeRawString(WHILE))
              .push_back(condition)
              .push_back(body);
  }